

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O3

FT_Error tt_size_run_prep(TT_Size size,FT_Bool pedantic)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  TT_Face face;
  FT_Int32 *pFVar3;
  ulong uVar4;
  FT_Long *pFVar5;
  TT_ExecContext exec;
  FT_ULong FVar6;
  FT_Byte *pFVar7;
  undefined8 uVar8;
  FT_UShort FVar9;
  FT_UShort FVar10;
  FT_F2Dot14 FVar11;
  FT_UInt FVar12;
  FT_Error FVar13;
  uint uVar14;
  TT_GraphicsState *pTVar15;
  ulong uVar16;
  TT_GraphicsState *pTVar17;
  long lVar18;
  byte bVar19;
  
  bVar19 = 0;
  face = (TT_Face)(size->root).face;
  if (size->cvt_size != 0) {
    pFVar3 = face->cvt;
    uVar4 = (size->ttmetrics).scale;
    pFVar5 = size->cvt;
    uVar14 = 1;
    uVar16 = 0;
    do {
      lVar18 = (long)pFVar3[uVar16] * (long)(int)(uVar4 >> 6);
      pFVar5[uVar16] = (long)(int)((ulong)(lVar18 + (lVar18 >> 0x3f) + 0x8000) >> 0x10);
      uVar16 = (ulong)uVar14;
      uVar14 = uVar14 + 1;
    } while (uVar16 < size->cvt_size);
  }
  exec = size->context;
  FVar13 = TT_Load_Context(exec,face,size);
  if (FVar13 == 0) {
    exec->callTop = 0;
    exec->top = 0;
    exec->instruction_trap = '\0';
    exec->pedantic_hinting = pedantic;
    FVar6 = face->cvt_program_size;
    pFVar7 = face->cvt_program;
    exec->codeRangeTable[1].base = pFVar7;
    exec->codeRangeTable[1].size = FVar6;
    exec->codeRangeTable[2].base = (FT_Byte *)0x0;
    exec->codeRangeTable[2].size = 0;
    if (face->cvt_program_size == 0) {
      FVar13 = 0;
    }
    else {
      exec->code = pFVar7;
      exec->codeSize = FVar6;
      exec->IP = 0;
      exec->curRange = 2;
      FVar13 = (*face->interpreter)(exec);
    }
    size->cvt_ready = FVar13;
    (exec->GS).freeVector.y = 0;
    (exec->GS).rp0 = 0;
    (exec->GS).rp1 = 0;
    (exec->GS).rp2 = 0;
    (exec->GS).dualVector.x = 0x4000;
    *(undefined8 *)&(exec->GS).dualVector.y = 0x4000000040000000;
    (exec->GS).gep0 = 1;
    (exec->GS).gep1 = 1;
    (exec->GS).gep2 = 1;
    (exec->GS).loop = 1;
    pTVar15 = &exec->GS;
    pTVar17 = &size->GS;
    for (lVar18 = 0xc; lVar18 != 0; lVar18 = lVar18 + -1) {
      FVar9 = pTVar15->rp1;
      FVar10 = pTVar15->rp2;
      FVar11 = (pTVar15->dualVector).x;
      pTVar17->rp0 = pTVar15->rp0;
      pTVar17->rp1 = FVar9;
      pTVar17->rp2 = FVar10;
      (pTVar17->dualVector).x = FVar11;
      pTVar15 = (TT_GraphicsState *)((long)pTVar15 + (ulong)bVar19 * -0x10 + 8);
      pTVar17 = (TT_GraphicsState *)((long)pTVar17 + (ulong)bVar19 * -0x10 + 8);
    }
    size->num_function_defs = exec->numFDefs;
    size->num_instruction_defs = exec->numIDefs;
    FVar12 = exec->maxIns;
    size->max_func = exec->maxFunc;
    size->max_ins = FVar12;
    lVar18 = 0;
    do {
      puVar1 = (undefined8 *)((long)&exec->codeRangeTable[0].base + lVar18);
      uVar8 = puVar1[1];
      puVar2 = (undefined8 *)((long)&size->codeRangeTable[0].base + lVar18);
      *puVar2 = *puVar1;
      puVar2[1] = uVar8;
      lVar18 = lVar18 + 0x10;
    } while (lVar18 != 0x30);
  }
  return FVar13;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_size_run_prep( TT_Size  size,
                    FT_Bool  pedantic )
  {
    TT_Face         face = (TT_Face)size->root.face;
    TT_ExecContext  exec;
    FT_Error        error;
    FT_UInt         i;

    /* unscaled CVT values are already stored in 26.6 format */
    FT_Fixed  scale = size->ttmetrics.scale >> 6;


    /* Scale the cvt values to the new ppem.            */
    /* By default, we use the y ppem value for scaling. */
    FT_TRACE6(( "CVT values:\n" ));
    for ( i = 0; i < size->cvt_size; i++ )
    {
      size->cvt[i] = FT_MulFix( face->cvt[i], scale );
      FT_TRACE6(( "  %3d: %f (%f)\n",
                  i, (double)face->cvt[i] / 64, (double)size->cvt[i] / 64 ));
    }
    FT_TRACE6(( "\n" ));

    exec = size->context;

    error = TT_Load_Context( exec, face, size );
    if ( error )
      return error;

    exec->callTop = 0;
    exec->top     = 0;

    exec->instruction_trap = FALSE;

    exec->pedantic_hinting = pedantic;

    TT_Set_CodeRange( exec,
                      tt_coderange_cvt,
                      face->cvt_program,
                      (FT_Long)face->cvt_program_size );

    TT_Clear_CodeRange( exec, tt_coderange_glyph );

    if ( face->cvt_program_size > 0 )
    {
      TT_Goto_CodeRange( exec, tt_coderange_cvt, 0 );

      FT_TRACE4(( "Executing `prep' table.\n" ));
      error = face->interpreter( exec );
#ifdef FT_DEBUG_LEVEL_TRACE
      if ( error )
        FT_TRACE4(( "  interpretation failed with error code 0x%x\n",
                    error ));
#endif
    }
    else
      error = FT_Err_Ok;

    size->cvt_ready = error;

    /* UNDOCUMENTED!  The MS rasterizer doesn't allow the following */
    /* graphics state variables to be modified by the CVT program.  */

    exec->GS.dualVector.x = 0x4000;
    exec->GS.dualVector.y = 0;
    exec->GS.projVector.x = 0x4000;
    exec->GS.projVector.y = 0x0;
    exec->GS.freeVector.x = 0x4000;
    exec->GS.freeVector.y = 0x0;

    exec->GS.rp0 = 0;
    exec->GS.rp1 = 0;
    exec->GS.rp2 = 0;

    exec->GS.gep0 = 1;
    exec->GS.gep1 = 1;
    exec->GS.gep2 = 1;

    exec->GS.loop = 1;

    /* save as default graphics state */
    size->GS = exec->GS;

    TT_Save_Context( exec, size );

    return error;
  }